

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ConnectorFederateManager::ConnectorFederateManager
          (ConnectorFederateManager *this,Core *coreObj,Federate *ffed,LocalFederateId fid,
          bool singleThreaded)

{
  this->coreObject = coreObj;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt(&this->filters,!singleThreaded);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt(&this->translators,!singleThreaded);
  this->fed = ffed;
  (this->fedID).fid = fid.fid;
  return;
}

Assistant:

ConnectorFederateManager::ConnectorFederateManager(Core* coreObj,
                                                   Federate* ffed,
                                                   LocalFederateId fid,
                                                   bool singleThreaded):
    coreObject(coreObj), filters(!singleThreaded), translators(!singleThreaded), fed(ffed),
    fedID(fid)
{
}